

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeMemGetIpcHandle(ze_context_handle_t hContext,void *ptr,ze_ipc_mem_handle_t *pIpcHandle)

{
  ze_pfnMemGetIpcHandle_t pfnGetIpcHandle;
  ze_result_t result;
  ze_ipc_mem_handle_t *pIpcHandle_local;
  void *ptr_local;
  ze_context_handle_t hContext_local;
  
  pfnGetIpcHandle._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c518 != (code *)0x0) {
    pfnGetIpcHandle._4_4_ = (*DAT_0011c518)(hContext,ptr,pIpcHandle);
  }
  return pfnGetIpcHandle._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeMemGetIpcHandle(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        const void* ptr,                                ///< [in] pointer to the device memory allocation
        ze_ipc_mem_handle_t* pIpcHandle                 ///< [out] Returned IPC memory handle
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetIpcHandle = context.zeDdiTable.Mem.pfnGetIpcHandle;
        if( nullptr != pfnGetIpcHandle )
        {
            result = pfnGetIpcHandle( hContext, ptr, pIpcHandle );
        }
        else
        {
            // generic implementation
        }

        return result;
    }